

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int prioritycmp(void *ax,void *ay)

{
  long lVar1;
  long lVar2;
  PNode *y;
  PNode *x;
  void *ay_local;
  void *ax_local;
  
  lVar1 = *ax;
  lVar2 = *ay;
  if ((*(int *)(lVar2 + 4) != 0) < (*(int *)(lVar1 + 4) != 0)) {
    ax_local._4_4_ = -1;
  }
  else if ((*(int *)(lVar1 + 4) != 0) < (*(int *)(lVar2 + 4) != 0)) {
    ax_local._4_4_ = 1;
  }
  else if (*(uint *)(lVar1 + 0x18) < *(uint *)(lVar2 + 0x18)) {
    ax_local._4_4_ = -1;
  }
  else if (*(uint *)(lVar2 + 0x18) < *(uint *)(lVar1 + 0x18)) {
    ax_local._4_4_ = 1;
  }
  else if (*(int *)(lVar2 + 8) < *(int *)(lVar1 + 8)) {
    ax_local._4_4_ = -1;
  }
  else if (*(int *)(lVar1 + 8) < *(int *)(lVar2 + 8)) {
    ax_local._4_4_ = 1;
  }
  else if (*(ulong *)(lVar1 + 0x98) < *(ulong *)(lVar2 + 0x98)) {
    ax_local._4_4_ = -1;
  }
  else if (*(ulong *)(lVar2 + 0x98) < *(ulong *)(lVar1 + 0x98)) {
    ax_local._4_4_ = 1;
  }
  else {
    ax_local._4_4_ = 0;
  }
  return ax_local._4_4_;
}

Assistant:

static int prioritycmp(const void *ax, const void *ay) {
  PNode *x = *(PNode **)ax;
  PNode *y = *(PNode **)ay;
  /* sort those with no priority to the bottom */
  if (!!x->assoc > !!y->assoc) return -1;
  if (!!x->assoc < !!y->assoc) return 1;
  /* by smallest height */
  if (x->height < y->height) return -1;
  if (x->height > y->height) return 1;
  /* by highest priority */
  if (x->priority > y->priority) return -1;
  if (x->priority < y->priority) return 1;
  /* by earliest start */
  if (x->parse_node.start_loc.s < y->parse_node.start_loc.s) return -1;
  if (x->parse_node.start_loc.s > y->parse_node.start_loc.s) return 1;
  return 0;
}